

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O0

ngx_chain_t * ngx_create_chain_of_bufs(ngx_pool_t *pool,ngx_bufs_t *bufs)

{
  ngx_chain_t *pnVar1;
  ngx_chain_t **local_50;
  ngx_chain_t **ll;
  ngx_chain_t *cl;
  ngx_chain_t *chain;
  ngx_buf_t *b;
  ngx_int_t i;
  u_char *p;
  ngx_bufs_t *bufs_local;
  ngx_pool_t *pool_local;
  
  p = (u_char *)bufs;
  bufs_local = (ngx_bufs_t *)pool;
  i = (ngx_int_t)ngx_palloc(pool,bufs->num * bufs->size);
  if ((void *)i == (void *)0x0) {
    pool_local = (ngx_pool_t *)0x0;
  }
  else {
    local_50 = &cl;
    for (b = (ngx_buf_t *)0x0; (long)b < *(long *)p; b = (ngx_buf_t *)((long)&b->pos + 1)) {
      chain = (ngx_chain_t *)ngx_pcalloc((ngx_pool_t *)bufs_local,0x50);
      if (chain == (ngx_chain_t *)0x0) {
        return (ngx_chain_t *)0x0;
      }
      chain->buf = (ngx_buf_t *)i;
      chain->next = (ngx_chain_t *)i;
      *(ushort *)&chain[4].next = *(ushort *)&chain[4].next & 0xfffe | 1;
      chain[2].buf = (ngx_buf_t *)i;
      i = *(long *)(p + 8) + i;
      chain[2].next = (ngx_chain_t *)i;
      pnVar1 = ngx_alloc_chain_link((ngx_pool_t *)bufs_local);
      if (pnVar1 == (ngx_chain_t *)0x0) {
        return (ngx_chain_t *)0x0;
      }
      pnVar1->buf = (ngx_buf_t *)chain;
      *local_50 = pnVar1;
      local_50 = &pnVar1->next;
    }
    *local_50 = (ngx_chain_t *)0x0;
    pool_local = (ngx_pool_t *)cl;
  }
  return (ngx_chain_t *)pool_local;
}

Assistant:

ngx_chain_t *
ngx_create_chain_of_bufs(ngx_pool_t *pool, ngx_bufs_t *bufs)
{
    u_char       *p;
    ngx_int_t     i;
    ngx_buf_t    *b;
    ngx_chain_t  *chain, *cl, **ll;

    p = ngx_palloc(pool, bufs->num * bufs->size);
    if (p == NULL) {
        return NULL;
    }

    ll = &chain;

    for (i = 0; i < bufs->num; i++) {

        b = ngx_calloc_buf(pool);
        if (b == NULL) {
            return NULL;
        }

        /*
         * set by ngx_calloc_buf():
         *
         *     b->file_pos = 0;
         *     b->file_last = 0;
         *     b->file = NULL;
         *     b->shadow = NULL;
         *     b->tag = 0;
         *     and flags
         *
         */

        b->pos = p;
        b->last = p;
        b->temporary = 1;

        b->start = p;
        p += bufs->size;
        b->end = p;

        cl = ngx_alloc_chain_link(pool);
        if (cl == NULL) {
            return NULL;
        }

        cl->buf = b;
        *ll = cl;
        ll = &cl->next;
    }

    *ll = NULL;

    return chain;
}